

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>::
index_key_value<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
           *this,key_type *Name,int64_t Index,json_array_arg_t *args,semantic_tag *args_1)

{
  undefined1 local_19;
  
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)Name);
  *(int64_t *)(this + 0x20) = Index;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)(this + 0x28)
             ,*args_1,&local_19);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }